

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_namer.h
# Opt level: O0

string * __thiscall
flatbuffers::IdlNamer::LegacyKotlinMethod
          (string *__return_storage_ptr__,IdlNamer *this,string *prefix,FieldDef *d,string *suffix)

{
  string local_90;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  string *local_30;
  string *suffix_local;
  FieldDef *d_local;
  string *prefix_local;
  IdlNamer *this_local;
  
  local_30 = suffix;
  suffix_local = (string *)d;
  d_local = (FieldDef *)prefix;
  prefix_local = (string *)this;
  this_local = (IdlNamer *)__return_storage_ptr__;
  (*(this->super_Namer)._vptr_Namer[0xe])(&local_90,this,d);
  ConvertCase(&local_70,&local_90,kUpperCamel,kSnake);
  std::operator+(&local_50,prefix,&local_70);
  std::operator+(__return_storage_ptr__,&local_50,local_30);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_90);
  return __return_storage_ptr__;
}

Assistant:

std::string LegacyKotlinMethod(const std::string &prefix, const FieldDef &d,
                                 const std::string &suffix) const {
    return prefix + ConvertCase(EscapeKeyword(d.name), Case::kUpperCamel) +
           suffix;
  }